

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O2

void __thiscall
qpdf::is::OffsetBuffer::OffsetBuffer
          (OffsetBuffer *this,string *description,Buffer *buf,qpdf_offset_t global_offset)

{
  logic_error *this_00;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__OffsetBuffer_002b0b98;
  BufferInputSource::BufferInputSource(&this->proxied,description,buf,false);
  this->global_offset = global_offset;
  if (-1 < global_offset) {
    (this->super_InputSource).last_offset = global_offset;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"is::OffsetBuffer constructed with negative offset");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

OffsetBuffer(std::string const& description, Buffer* buf, qpdf_offset_t global_offset) :
            proxied(description, buf),
            global_offset(global_offset)
        {
            if (global_offset < 0) {
                throw std::logic_error("is::OffsetBuffer constructed with negative offset");
            }
            last_offset = global_offset;
        }